

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_LinkedModel_2eproto::TableStruct::InitDefaultsImpl(void)

{
  StringParameter *pSVar1;
  LinkedModelFile *pLVar2;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/LinkedModel.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinkedModel>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::LinkedModel> *)
                   _LinkedModel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinkedModelFile>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::LinkedModelFile> *)
                   _LinkedModelFile_default_instance_);
  pSVar1 = StringParameter::internal_default_instance();
  pLVar2 = google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinkedModelFile>
           ::get_mutable((ExplicitlyConstructed<CoreML::Specification::LinkedModelFile> *)
                         _LinkedModelFile_default_instance_);
  pLVar2->linkedmodelfilename_ = pSVar1;
  pSVar1 = StringParameter::internal_default_instance();
  pLVar2 = google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinkedModelFile>
           ::get_mutable((ExplicitlyConstructed<CoreML::Specification::LinkedModelFile> *)
                         _LinkedModelFile_default_instance_);
  pLVar2->linkedmodelsearchpath_ = pSVar1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  _LinkedModel_default_instance_.DefaultConstruct();
  _LinkedModelFile_default_instance_.DefaultConstruct();
  _LinkedModelFile_default_instance_.get_mutable()->linkedmodelfilename_ = const_cast< ::CoreML::Specification::StringParameter*>(
      ::CoreML::Specification::StringParameter::internal_default_instance());
  _LinkedModelFile_default_instance_.get_mutable()->linkedmodelsearchpath_ = const_cast< ::CoreML::Specification::StringParameter*>(
      ::CoreML::Specification::StringParameter::internal_default_instance());
}